

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

void ctemplate_htmlparser::htmlparser_copy(htmlparser_ctx *dst,htmlparser_ctx *src)

{
  htmlparser_ctx *src_local;
  htmlparser_ctx *dst_local;
  
  dst->value_index = src->value_index;
  dst->in_js = src->in_js;
  strcpy(dst->tag,src->tag);
  strcpy(dst->attr,src->attr);
  strcpy(dst->value,src->value);
  statemachine_copy(dst->statemachine,src->statemachine,dst->statemachine_def,dst);
  jsparser_copy(dst->jsparser,src->jsparser);
  entityfilter_copy(dst->entityfilter,src->entityfilter);
  return;
}

Assistant:

void htmlparser_copy(htmlparser_ctx *dst, const htmlparser_ctx *src)
{
  dst->value_index = src->value_index;
  dst->in_js = src->in_js;
  strcpy(dst->tag, src->tag);
  strcpy(dst->attr, src->attr);
  strcpy(dst->value, src->value);

  statemachine_copy(dst->statemachine,
                    src->statemachine,
                    dst->statemachine_def,
                    dst);

  jsparser_copy(dst->jsparser, src->jsparser);

  entityfilter_copy(dst->entityfilter, src->entityfilter);

}